

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
::set_ctrl(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
           *this,size_t i,ctrl_t h)

{
  bool bVar1;
  ctrl_t in_DL;
  ulong in_RSI;
  long *in_RDI;
  
  if (in_RSI < (ulong)in_RDI[3]) {
    bVar1 = IsFull(in_DL);
    if (bVar1) {
      SanitizerUnpoisonObject<phmap::priv::map_slot_type<std::__cxx11::string,std::shared_ptr<cs::name_space>>>
                ((map_slot_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
                  *)0x146001);
    }
    else {
      SanitizerPoisonObject<phmap::priv::map_slot_type<std::__cxx11::string,std::shared_ptr<cs::name_space>>>
                ((map_slot_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
                  *)0x14601a);
    }
    *(ctrl_t *)(*in_RDI + in_RSI) = in_DL;
    *(ctrl_t *)(*in_RDI + (in_RSI - 0x10 & in_RDI[3]) + 1 + (in_RDI[3] & 0xfU)) = in_DL;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x9cd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::shared_ptr<cs::name_space>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::shared_ptr<cs::name_space>>>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::shared_ptr<cs::name_space>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::shared_ptr<cs::name_space>>>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h)
			{
				assert(i < capacity_);

				if (IsFull(h)) {
					SanitizerUnpoisonObject(slots_ + i);
				}
				else {
					SanitizerPoisonObject(slots_ + i);
				}

				ctrl_[i] = h;
				ctrl_[((i - Group::kWidth) & capacity_) + 1 +
				                           ((Group::kWidth - 1) & capacity_)] = h;
			}